

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<unsigned_long_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<unsigned_long_const&> *this,uint *rhs)

{
  uint uVar1;
  lest *this_00;
  ulong uVar2;
  uint *in_R8;
  allocator local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  uVar2 = *(ulong *)this_00;
  uVar1 = *rhs;
  std::__cxx11::string::string(local_50,"==",&local_71);
  to_string<unsigned_long,unsigned_int>
            (&local_70,this_00,(unsigned_long *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = uVar2 == uVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }